

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<converterApp>::ParameterizedTestSuiteInfo
          (ParameterizedTestSuiteInfo<converterApp> *this,string *name,CodeLocation *code_location)

{
  CodeLocation *code_location_local;
  string *name_local;
  ParameterizedTestSuiteInfo<converterApp> *this_local;
  
  ParameterizedTestSuiteInfoBase::ParameterizedTestSuiteInfoBase
            (&this->super_ParameterizedTestSuiteInfoBase);
  (this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
       (_func_int **)&PTR__ParameterizedTestSuiteInfo_0021a780;
  std::__cxx11::string::string((string *)&this->test_suite_name_,(string *)name);
  CodeLocation::CodeLocation(&this->code_location_,code_location);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<converterApp>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<converterApp>::TestInfo>_>_>
  ::vector(&this->tests_);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<converterApp>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<converterApp>::InstantiationInfo>_>
  ::vector(&this->instantiations_);
  return;
}

Assistant:

explicit ParameterizedTestSuiteInfo(std::string name,
                                      CodeLocation code_location)
      : test_suite_name_(std::move(name)),
        code_location_(std::move(code_location)) {}